

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

bool __thiscall
cmCTestRunTest::EndTest(cmCTestRunTest *this,size_t completed,size_t total,bool started)

{
  cmCTest *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  Exception EVar6;
  uint uVar7;
  pointer pcVar8;
  int64_t iVar9;
  vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pvVar10;
  reference ppVar11;
  ostream *poVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  void *this_00;
  bool bVar17;
  rep_conflict rVar18;
  cmDuration cVar19;
  string *local_15c8;
  bool local_15b3;
  int local_14dc;
  byte local_1415;
  byte local_1414;
  State local_1408;
  undefined1 local_13e8 [7];
  bool compress;
  string str;
  string compressedOutput;
  char local_1388 [8];
  char buffer [100];
  duration<long,_std::ratio<1L,_1L>_> local_1318;
  __enable_if_is_duration<std::chrono::duration<long>_> seconds;
  duration<long,_std::ratio<60L,_1L>_> local_1308;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<60L>_>_> minutes;
  duration<long,_std::ratio<3600L,_1L>_> local_12f8;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<3600L>_>_> hours;
  cmDuration ttime;
  char *reasonType;
  string local_12d8 [7];
  bool pass_2;
  undefined1 local_12b8 [8];
  ostringstream cmCTestLog_msg_4;
  string local_1140 [32];
  string local_1120 [32];
  undefined1 local_1100 [8];
  ostringstream cmCTestLog_msg_3;
  string local_f88 [32];
  undefined1 local_f68 [8];
  ostringstream cmCTestLog_msg_2;
  string local_df0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dd0;
  undefined1 local_db0 [8];
  string testName_1;
  undefined1 local_d70 [8];
  ostringstream cmCTestLog_msg_1;
  allocator<char> local_bf1;
  string local_bf0 [32];
  string local_bd0 [36];
  int local_bac;
  string local_ba8 [4];
  int maxTestNameWidth;
  string testName;
  string output;
  cmDuration cStack_b60;
  bool passedOrSkipped;
  char local_b58 [8];
  char buf [1024];
  undefined1 local_738 [8];
  ostringstream cmCTestLog_msg;
  string local_5c0;
  string local_5a0 [32];
  undefined1 local_580 [8];
  ostringstream s;
  undefined1 auStack_400 [7];
  bool success;
  ostringstream outputStream;
  char local_281;
  cmAlphaNum local_280;
  cmAlphaNum local_250;
  string local_220;
  reference local_200;
  pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *skip;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2_2;
  cmAlphaNum local_1d8;
  cmAlphaNum local_1a8;
  string local_178;
  reference local_158;
  pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *fail;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2_1;
  pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pass_1;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range3;
  cmAlphaNum local_110;
  cmAlphaNum local_e0;
  string local_b0;
  reference local_90;
  pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pass;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  bool found;
  bool outputTestErrorsToConsole;
  bool skipped;
  bool forceSkip;
  bool forceFail;
  int64_t retVal;
  State res;
  bool passed;
  string reason;
  bool started_local;
  size_t total_local;
  size_t completed_local;
  cmCTestRunTest *this_local;
  
  reason.field_2._M_local_buf[0xf] = started;
  WriteLogOutputTop(this,completed,total);
  std::__cxx11::string::string((string *)&res);
  if ((reason.field_2._M_local_buf[0xf] & 1U) == 0) {
    local_1408 = Error;
  }
  else {
    pcVar8 = std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::operator->
                       (&this->TestProcess);
    local_1408 = cmProcess::GetProcessStatus(pcVar8);
  }
  if (local_1408 != Expired) {
    this->TimeoutIsForStopTime = false;
  }
  pcVar8 = std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::operator->
                     (&this->TestProcess);
  iVar9 = cmProcess::GetExitValue(pcVar8);
  bVar5 = false;
  bVar17 = false;
  bVar2 = false;
  __range2._4_1_ = false;
  bVar3 = std::
          vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&this->TestProperties->RequiredRegularExpressions);
  if ((!bVar3) &&
     (bVar3 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->FailedDependencies), bVar3)) {
    bVar3 = false;
    pvVar10 = &this->TestProperties->RequiredRegularExpressions;
    __end2 = std::
             vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(pvVar10);
    pass = (pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end(pvVar10);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       *)&pass), bVar4) {
      local_90 = __gnu_cxx::
                 __normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator*(&__end2);
      bVar4 = cmsys::RegularExpression::find(&local_90->first,&this->ProcessOutput);
      if (bVar4) {
        bVar3 = true;
        cmAlphaNum::cmAlphaNum(&local_e0,"Required regular expression found. Regex=[");
        cmAlphaNum::cmAlphaNum(&local_110,&local_90->second);
        __range3._7_1_ = 0x5d;
        cmStrCat<char>(&local_b0,&local_e0,&local_110,(char *)((long)&__range3 + 7));
        std::__cxx11::string::operator=((string *)&res,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        break;
      }
      __gnu_cxx::
      __normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end2);
    }
    if (!bVar3) {
      std::__cxx11::string::operator=
                ((string *)&res,"Required regular expression not found. Regex=[");
      pvVar10 = &this->TestProperties->RequiredRegularExpressions;
      __end3 = std::
               vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(pvVar10);
      pass_1 = (pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)std::
                  vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::end(pvVar10);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                         *)&pass_1), bVar5) {
        ppVar11 = __gnu_cxx::
                  __normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator*(&__end3);
        std::__cxx11::string::operator+=((string *)&res,(string *)&ppVar11->second);
        std::__cxx11::string::operator+=((string *)&res,"\n");
        __gnu_cxx::
        __normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator++(&__end3);
      }
      std::__cxx11::string::operator+=((string *)&res,"]");
      bVar5 = true;
    }
  }
  bVar3 = std::
          vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&this->TestProperties->ErrorRegularExpressions);
  if ((!bVar3) &&
     (bVar3 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->FailedDependencies), bVar3)) {
    pvVar10 = &this->TestProperties->ErrorRegularExpressions;
    __end2_1 = std::
               vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(pvVar10);
    fail = (pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end(pvVar10);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&fail), bVar3) {
      local_158 = __gnu_cxx::
                  __normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator*(&__end2_1);
      bVar3 = cmsys::RegularExpression::find(&local_158->first,&this->ProcessOutput);
      if (bVar3) {
        cmAlphaNum::cmAlphaNum(&local_1a8,"Error regular expression found in output. Regex=[");
        cmAlphaNum::cmAlphaNum(&local_1d8,&local_158->second);
        __range2_2._7_1_ = 0x5d;
        cmStrCat<char>(&local_178,&local_1a8,&local_1d8,(char *)((long)&__range2_2 + 7));
        std::__cxx11::string::operator=((string *)&res,(string *)&local_178);
        std::__cxx11::string::~string((string *)&local_178);
        bVar5 = true;
        break;
      }
      __gnu_cxx::
      __normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end2_1);
    }
  }
  bVar3 = std::
          vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&this->TestProperties->SkipRegularExpressions);
  if ((!bVar3) &&
     (bVar3 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->FailedDependencies), bVar3)) {
    pvVar10 = &this->TestProperties->SkipRegularExpressions;
    __end2_2 = std::
               vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(pvVar10);
    skip = (pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end(pvVar10);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&skip), bVar3) {
      local_200 = __gnu_cxx::
                  __normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator*(&__end2_2);
      bVar3 = cmsys::RegularExpression::find(&local_200->first,&this->ProcessOutput);
      if (bVar3) {
        cmAlphaNum::cmAlphaNum(&local_250,"Skip regular expression found in output. Regex=[");
        cmAlphaNum::cmAlphaNum(&local_280,&local_200->second);
        local_281 = ']';
        cmStrCat<char>(&local_220,&local_250,&local_280,&local_281);
        std::__cxx11::string::operator=((string *)&res,(string *)&local_220);
        std::__cxx11::string::~string((string *)&local_220);
        bVar17 = true;
        break;
      }
      __gnu_cxx::
      __normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end2_2);
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_400);
  if (local_1408 == Exited) {
    local_1414 = 0;
    if (!bVar5) {
      local_1415 = 1;
      if (iVar9 != 0) {
        bVar5 = std::
                vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::empty(&this->TestProperties->RequiredRegularExpressions);
        local_1415 = bVar5 ^ 0xff;
      }
      local_1414 = local_1415;
    }
    if (((-1 < this->TestProperties->SkipReturnCode) &&
        (this->TestProperties->SkipReturnCode == iVar9)) || (bVar17)) {
      (this->TestResult).Status = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
      if (bVar17) {
        std::operator<<((ostream *)local_580,"SKIP_REGULAR_EXPRESSION_MATCHED");
      }
      else {
        poVar12 = std::operator<<((ostream *)local_580,"SKIP_RETURN_CODE=");
        std::ostream::operator<<(poVar12,this->TestProperties->SkipReturnCode);
      }
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=((string *)&(this->TestResult).CompletionStatus,local_5a0);
      std::__cxx11::string::~string(local_5a0);
      std::operator<<((ostream *)auStack_400,"***Skipped ");
      bVar2 = true;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
    }
    else if ((local_1414 & 1) == (this->TestProperties->WillFail & 1U)) {
      (this->TestResult).Status = 7;
      poVar12 = std::operator<<((ostream *)auStack_400,"***Failed  ");
      std::operator<<(poVar12,(string *)&res);
      __range2._4_1_ = cmCTest::GetOutputTestOutputOnTestFailure(this->CTest);
    }
    else {
      (this->TestResult).Status = 9;
      std::operator<<((ostream *)auStack_400,"   Passed  ");
    }
  }
  else if (local_1408 == Expired) {
    std::operator<<((ostream *)auStack_400,"***Timeout ");
    (this->TestResult).Status = 1;
    __range2._4_1_ = cmCTest::GetOutputTestOutputOnTestFailure(this->CTest);
  }
  else if (local_1408 == Exception) {
    __range2._4_1_ = cmCTest::GetOutputTestOutputOnTestFailure(this->CTest);
    std::operator<<((ostream *)auStack_400,"***Exception: ");
    pcVar8 = std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::operator->
                       (&this->TestProcess);
    cmProcess::GetExitExceptionString_abi_cxx11_(&local_5c0,pcVar8);
    std::__cxx11::string::operator=
              ((string *)&(this->TestResult).ExceptionStatus,(string *)&local_5c0);
    std::__cxx11::string::~string((string *)&local_5c0);
    pcVar8 = std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::operator->
                       (&this->TestProcess);
    EVar6 = cmProcess::GetExitException(pcVar8);
    switch(EVar6) {
    case Fault:
      std::operator<<((ostream *)auStack_400,"SegFault");
      (this->TestResult).Status = 2;
      break;
    case Illegal:
      std::operator<<((ostream *)auStack_400,"Illegal");
      (this->TestResult).Status = 3;
      break;
    case Interrupt:
      std::operator<<((ostream *)auStack_400,"Interrupt");
      (this->TestResult).Status = 4;
      break;
    case Numerical:
      std::operator<<((ostream *)auStack_400,"Numerical");
      (this->TestResult).Status = 5;
      break;
    default:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_738);
      std::operator<<((ostream *)local_738,(string *)&(this->TestResult).ExceptionStatus);
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar13 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xd8,pcVar13,false);
      std::__cxx11::string::~string((string *)(buf + 0x3f8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_738);
      (this->TestResult).Status = 6;
    }
  }
  else {
    bVar5 = std::operator==("Disabled",&(this->TestResult).CompletionStatus);
    if (bVar5) {
      std::operator<<((ostream *)auStack_400,"***Not Run (Disabled) ");
    }
    else {
      std::operator<<((ostream *)auStack_400,"***Not Run ");
    }
  }
  bVar17 = (this->TestResult).Status != 9;
  pcVar8 = std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::operator->
                     (&this->TestProcess);
  cStack_b60 = cmProcess::GetTotalTime(pcVar8);
  rVar18 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&stack0xfffffffffffff4a0);
  snprintf(local_b58,0x400,"%6.2f sec",rVar18);
  poVar12 = std::operator<<((ostream *)auStack_400,local_b58);
  std::operator<<(poVar12,"\n");
  bVar5 = true;
  if (bVar17) {
    bVar5 = bVar2;
  }
  bVar3 = cmCTest::GetTestProgressOutput(this->CTest);
  if (bVar3) {
    if (bVar5 == false) {
      GetTestPrefix_abi_cxx11_((string *)((long)&testName.field_2 + 8),this,completed,total);
      std::__cxx11::string::string(local_ba8,(string *)this->TestProperties);
      local_bac = cmCTest::GetMaxTestNameWidth(this->CTest);
      std::__cxx11::string::resize((ulong)local_ba8,(char)local_bac + '\x04');
      std::__cxx11::string::operator+=((string *)(testName.field_2._M_local_buf + 8),local_ba8);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator+=((string *)(testName.field_2._M_local_buf + 8),local_bd0);
      std::__cxx11::string::~string(local_bd0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_bf0,"",&local_bf1);
      std::__cxx11::ostringstream::str((string *)auStack_400);
      std::__cxx11::string::~string(local_bf0);
      std::allocator<char>::~allocator(&local_bf1);
      std::ios::clear((int)auStack_400 + (int)_auStack_400[-3]);
      std::operator<<((ostream *)auStack_400,(string *)(testName.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d70);
      std::operator<<((ostream *)local_d70,"\n");
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar13 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xf6,pcVar13,false);
      std::__cxx11::string::~string((string *)(testName_1.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d70);
      std::__cxx11::string::~string(local_ba8);
      std::__cxx11::string::~string((string *)(testName.field_2._M_local_buf + 8));
    }
    if (completed == total) {
      GetTestPrefix_abi_cxx11_(&local_df0,this,completed,total);
      std::operator+(&local_dd0,&local_df0,&this->TestProperties->Name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_db0,
                     &local_dd0,"\n");
      std::__cxx11::string::~string((string *)&local_dd0);
      std::__cxx11::string::~string((string *)&local_df0);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f68);
      std::operator<<((ostream *)local_f68,(string *)local_db0);
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar13 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xfb,pcVar13,false);
      std::__cxx11::string::~string(local_f88);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f68);
      std::__cxx11::string::~string((string *)local_db0);
    }
  }
  bVar3 = cmCTest::GetTestProgressOutput(this->CTest);
  if ((!bVar3) || (bVar5 == false)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1100);
    std::__cxx11::ostringstream::str();
    std::operator<<((ostream *)local_1100,local_1120);
    std::__cxx11::string::~string(local_1120);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar13 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0xff,pcVar13,false);
    std::__cxx11::string::~string(local_1140);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1100);
  }
  if (__range2._4_1_ != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_12b8);
    poVar12 = std::operator<<((ostream *)local_12b8,(string *)&this->ProcessOutput);
    std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar13 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x103,pcVar13,false);
    std::__cxx11::string::~string(local_12d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_12b8);
  }
  if (this->TestHandler->LogFile != (ostream *)0x0) {
    poVar12 = std::operator<<(this->TestHandler->LogFile,"Test time = ");
    poVar12 = std::operator<<(poVar12,local_b58);
    std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  }
  ParseOutputForMeasurements(this);
  if (((this->TestHandler->MemCheck & 1U) == 0) && ((reason.field_2._M_local_buf[0xf] & 1U) != 0)) {
    if ((this->TestResult).Status == 9) {
      local_14dc = this->TestHandler->CustomMaximumPassedTestOutputSize;
    }
    else {
      local_14dc = this->TestHandler->CustomMaximumFailedTestOutputSize;
    }
    cmCTestTestHandler::CleanTestOutput
              (this->TestHandler,&this->ProcessOutput,(long)local_14dc,
               this->TestHandler->TestOutputTruncation);
  }
  std::__cxx11::string::operator=((string *)&(this->TestResult).Reason,(string *)&res);
  if (this->TestHandler->LogFile != (ostream *)0x0) {
    bVar5 = true;
    ttime.__r = (rep_conflict)anon_var_dwarf_35cc08;
    if (((this->TestResult).Status != 9) && ((this->TestResult).Status != 0)) {
      ttime.__r = (rep_conflict)anon_var_dwarf_35cc1f;
      bVar5 = false;
    }
    pcVar8 = std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::operator->
                       (&this->TestProcess);
    hours.__r = (rep)cmProcess::GetTotalTime(pcVar8);
    local_12f8.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<3600l,1l>>,double,std::ratio<1l,1l>>
                        ((duration<double,_std::ratio<1L,_1L>_> *)&hours);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<3600l,1l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&minutes,&local_12f8);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator-=
              ((duration<double,_std::ratio<1L,_1L>_> *)&hours,
               (duration<double,_std::ratio<1L,_1L>_> *)&minutes);
    local_1308.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<60l,1l>>,double,std::ratio<1l,1l>>
                        ((duration<double,_std::ratio<1L,_1L>_> *)&hours);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<60l,1l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&seconds,&local_1308);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator-=
              ((duration<double,_std::ratio<1L,_1L>_> *)&hours,
               (duration<double,_std::ratio<1L,_1L>_> *)&seconds);
    local_1318.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,double,std::ratio<1l,1l>>
                        ((duration<double,_std::ratio<1L,_1L>_> *)&hours);
    uVar14 = std::chrono::duration<long,_std::ratio<3600L,_1L>_>::count(&local_12f8);
    uVar15 = std::chrono::duration<long,_std::ratio<60L,_1L>_>::count(&local_1308);
    uVar16 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_1318);
    snprintf(local_1388,100,"%02d:%02d:%02d",uVar14 & 0xffffffff,uVar15 & 0xffffffff,
             uVar16 & 0xffffffff);
    poVar12 = std::operator<<(this->TestHandler->LogFile,
                              "----------------------------------------------------------");
    std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
    uVar14 = std::__cxx11::string::empty();
    if ((uVar14 & 1) == 0) {
      poVar12 = std::operator<<(this->TestHandler->LogFile,(char *)ttime.__r);
      poVar12 = std::operator<<(poVar12,":\n");
      poVar12 = std::operator<<(poVar12,(string *)&(this->TestResult).Reason);
      std::operator<<(poVar12,"\n");
    }
    else if (bVar5) {
      std::operator<<(this->TestHandler->LogFile,"Test Passed.\n");
    }
    else {
      std::operator<<(this->TestHandler->LogFile,"Test Failed.\n");
    }
    poVar12 = std::operator<<(this->TestHandler->LogFile,"\"");
    poVar12 = std::operator<<(poVar12,(string *)this->TestProperties);
    poVar12 = std::operator<<(poVar12,"\" end time: ");
    cmCTest::CurrentTime_abi_cxx11_((string *)((long)&compressedOutput.field_2 + 8),this->CTest);
    poVar12 = std::operator<<(poVar12,(string *)(compressedOutput.field_2._M_local_buf + 8));
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
    poVar12 = std::operator<<(poVar12,"\"");
    poVar12 = std::operator<<(poVar12,(string *)this->TestProperties);
    poVar12 = std::operator<<(poVar12,"\" time elapsed: ");
    poVar12 = std::operator<<(poVar12,local_1388);
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
    poVar12 = std::operator<<(poVar12,"----------------------------------------------------------");
    this_00 = (void *)std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)(compressedOutput.field_2._M_local_buf + 8));
  }
  if ((reason.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::__cxx11::string::string((string *)(str.field_2._M_local_buf + 8));
    if (((this->TestHandler->MemCheck & 1U) == 0) &&
       (bVar5 = cmCTest::ShouldCompressTestOutput(this->CTest), bVar5)) {
      std::__cxx11::string::string((string *)local_13e8,(string *)&this->ProcessOutput);
      bVar5 = cmCTest::CompressString(this->CTest,(string *)local_13e8);
      if (bVar5) {
        std::__cxx11::string::operator=
                  ((string *)(str.field_2._M_local_buf + 8),(string *)local_13e8);
      }
      std::__cxx11::string::~string((string *)local_13e8);
    }
    uVar7 = std::__cxx11::string::empty();
    local_15b3 = false;
    if ((uVar7 & 1) == 0) {
      uVar14 = std::__cxx11::string::length();
      uVar15 = std::__cxx11::string::length();
      local_15b3 = uVar14 < uVar15;
    }
    if (local_15b3 == false) {
      local_15c8 = (string *)&this->ProcessOutput;
    }
    else {
      local_15c8 = (string *)(str.field_2._M_local_buf + 8);
    }
    std::__cxx11::string::operator=((string *)&(this->TestResult).Output,local_15c8);
    (this->TestResult).CompressOutput = local_15b3;
    pcVar8 = std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::operator->
                       (&this->TestProcess);
    iVar9 = cmProcess::GetExitValue(pcVar8);
    (this->TestResult).ReturnValue = iVar9;
    if (bVar2 == false) {
      std::__cxx11::string::operator=((string *)&(this->TestResult).CompletionStatus,"Completed");
    }
    pcVar8 = std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::operator->
                       (&this->TestProcess);
    cVar19 = cmProcess::GetTotalTime(pcVar8);
    (this->TestResult).ExecutionTime.__r = cVar19.__r;
    MemCheckPostProcess(this);
    ComputeWeightedCost(this);
    std::__cxx11::string::~string((string *)(str.field_2._M_local_buf + 8));
  }
  bVar5 = NeedsToRepeat(this);
  if (!bVar5) {
    std::
    vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ::push_back(&this->TestHandler->TestResults,&this->TestResult);
  }
  std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::reset
            (&this->TestProcess,(pointer)0x0);
  bVar5 = true;
  if (bVar17) {
    bVar5 = bVar2;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_400);
  std::__cxx11::string::~string((string *)&res);
  return bVar5;
}

Assistant:

bool cmCTestRunTest::EndTest(size_t completed, size_t total, bool started)
{
  this->WriteLogOutputTop(completed, total);
  std::string reason;
  bool passed = true;
  cmProcess::State res =
    started ? this->TestProcess->GetProcessStatus() : cmProcess::State::Error;
  if (res != cmProcess::State::Expired) {
    this->TimeoutIsForStopTime = false;
  }
  std::int64_t retVal = this->TestProcess->GetExitValue();
  bool forceFail = false;
  bool forceSkip = false;
  bool skipped = false;
  bool outputTestErrorsToConsole = false;
  if (!this->TestProperties->RequiredRegularExpressions.empty() &&
      this->FailedDependencies.empty()) {
    bool found = false;
    for (auto& pass : this->TestProperties->RequiredRegularExpressions) {
      if (pass.first.find(this->ProcessOutput)) {
        found = true;
        reason = cmStrCat("Required regular expression found. Regex=[",
                          pass.second, ']');
        break;
      }
    }
    if (!found) {
      reason = "Required regular expression not found. Regex=[";
      for (auto& pass : this->TestProperties->RequiredRegularExpressions) {
        reason += pass.second;
        reason += "\n";
      }
      reason += "]";
      forceFail = true;
    }
  }
  if (!this->TestProperties->ErrorRegularExpressions.empty() &&
      this->FailedDependencies.empty()) {
    for (auto& fail : this->TestProperties->ErrorRegularExpressions) {
      if (fail.first.find(this->ProcessOutput)) {
        reason = cmStrCat("Error regular expression found in output. Regex=[",
                          fail.second, ']');
        forceFail = true;
        break;
      }
    }
  }
  if (!this->TestProperties->SkipRegularExpressions.empty() &&
      this->FailedDependencies.empty()) {
    for (auto& skip : this->TestProperties->SkipRegularExpressions) {
      if (skip.first.find(this->ProcessOutput)) {
        reason = cmStrCat("Skip regular expression found in output. Regex=[",
                          skip.second, ']');
        forceSkip = true;
        break;
      }
    }
  }
  std::ostringstream outputStream;
  if (res == cmProcess::State::Exited) {
    bool success = !forceFail &&
      (retVal == 0 ||
       !this->TestProperties->RequiredRegularExpressions.empty());
    if ((this->TestProperties->SkipReturnCode >= 0 &&
         this->TestProperties->SkipReturnCode == retVal) ||
        forceSkip) {
      this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
      std::ostringstream s;
      if (forceSkip) {
        s << "SKIP_REGULAR_EXPRESSION_MATCHED";
      } else {
        s << "SKIP_RETURN_CODE=" << this->TestProperties->SkipReturnCode;
      }
      this->TestResult.CompletionStatus = s.str();
      outputStream << "***Skipped ";
      skipped = true;
    } else if (success != this->TestProperties->WillFail) {
      this->TestResult.Status = cmCTestTestHandler::COMPLETED;
      outputStream << "   Passed  ";
    } else {
      this->TestResult.Status = cmCTestTestHandler::FAILED;
      outputStream << "***Failed  " << reason;
      outputTestErrorsToConsole =
        this->CTest->GetOutputTestOutputOnTestFailure();
    }
  } else if (res == cmProcess::State::Expired) {
    outputStream << "***Timeout ";
    this->TestResult.Status = cmCTestTestHandler::TIMEOUT;
    outputTestErrorsToConsole =
      this->CTest->GetOutputTestOutputOnTestFailure();
  } else if (res == cmProcess::State::Exception) {
    outputTestErrorsToConsole =
      this->CTest->GetOutputTestOutputOnTestFailure();
    outputStream << "***Exception: ";
    this->TestResult.ExceptionStatus =
      this->TestProcess->GetExitExceptionString();
    switch (this->TestProcess->GetExitException()) {
      case cmProcess::Exception::Fault:
        outputStream << "SegFault";
        this->TestResult.Status = cmCTestTestHandler::SEGFAULT;
        break;
      case cmProcess::Exception::Illegal:
        outputStream << "Illegal";
        this->TestResult.Status = cmCTestTestHandler::ILLEGAL;
        break;
      case cmProcess::Exception::Interrupt:
        outputStream << "Interrupt";
        this->TestResult.Status = cmCTestTestHandler::INTERRUPT;
        break;
      case cmProcess::Exception::Numerical:
        outputStream << "Numerical";
        this->TestResult.Status = cmCTestTestHandler::NUMERICAL;
        break;
      default:
        cmCTestLog(this->CTest, HANDLER_OUTPUT,
                   this->TestResult.ExceptionStatus);
        this->TestResult.Status = cmCTestTestHandler::OTHER_FAULT;
    }
  } else if ("Disabled" == this->TestResult.CompletionStatus) {
    outputStream << "***Not Run (Disabled) ";
  } else // cmProcess::State::Error
  {
    outputStream << "***Not Run ";
  }

  passed = this->TestResult.Status == cmCTestTestHandler::COMPLETED;
  char buf[1024];
  snprintf(buf, sizeof(buf), "%6.2f sec",
           this->TestProcess->GetTotalTime().count());
  outputStream << buf << "\n";

  bool passedOrSkipped = passed || skipped;
  if (this->CTest->GetTestProgressOutput()) {
    if (!passedOrSkipped) {
      // If the test did not pass, reprint test name and error
      std::string output = this->GetTestPrefix(completed, total);
      std::string testName = this->TestProperties->Name;
      const int maxTestNameWidth = this->CTest->GetMaxTestNameWidth();
      testName.resize(maxTestNameWidth + 4, '.');

      output += testName;
      output += outputStream.str();
      outputStream.str("");
      outputStream.clear();
      outputStream << output;
      cmCTestLog(this->CTest, HANDLER_TEST_PROGRESS_OUTPUT, "\n"); // flush
    }
    if (completed == total) {
      std::string testName = this->GetTestPrefix(completed, total) +
        this->TestProperties->Name + "\n";
      cmCTestLog(this->CTest, HANDLER_TEST_PROGRESS_OUTPUT, testName);
    }
  }
  if (!this->CTest->GetTestProgressOutput() || !passedOrSkipped) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, outputStream.str());
  }

  if (outputTestErrorsToConsole) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, this->ProcessOutput << std::endl);
  }

  if (this->TestHandler->LogFile) {
    *this->TestHandler->LogFile << "Test time = " << buf << std::endl;
  }

  this->ParseOutputForMeasurements();

  // if this is doing MemCheck then all the output needs to be put into
  // Output since that is what is parsed by cmCTestMemCheckHandler
  if (!this->TestHandler->MemCheck && started) {
    this->TestHandler->CleanTestOutput(
      this->ProcessOutput,
      static_cast<size_t>(
        this->TestResult.Status == cmCTestTestHandler::COMPLETED
          ? this->TestHandler->CustomMaximumPassedTestOutputSize
          : this->TestHandler->CustomMaximumFailedTestOutputSize),
      this->TestHandler->TestOutputTruncation);
  }
  this->TestResult.Reason = reason;
  if (this->TestHandler->LogFile) {
    bool pass = true;
    const char* reasonType = "Test Pass Reason";
    if (this->TestResult.Status != cmCTestTestHandler::COMPLETED &&
        this->TestResult.Status != cmCTestTestHandler::NOT_RUN) {
      reasonType = "Test Fail Reason";
      pass = false;
    }
    auto ttime = this->TestProcess->GetTotalTime();
    auto hours = std::chrono::duration_cast<std::chrono::hours>(ttime);
    ttime -= hours;
    auto minutes = std::chrono::duration_cast<std::chrono::minutes>(ttime);
    ttime -= minutes;
    auto seconds = std::chrono::duration_cast<std::chrono::seconds>(ttime);
    char buffer[100];
    snprintf(buffer, sizeof(buffer), "%02d:%02d:%02d",
             static_cast<unsigned>(hours.count()),
             static_cast<unsigned>(minutes.count()),
             static_cast<unsigned>(seconds.count()));
    *this->TestHandler->LogFile
      << "----------------------------------------------------------"
      << std::endl;
    if (!this->TestResult.Reason.empty()) {
      *this->TestHandler->LogFile << reasonType << ":\n"
                                  << this->TestResult.Reason << "\n";
    } else {
      if (pass) {
        *this->TestHandler->LogFile << "Test Passed.\n";
      } else {
        *this->TestHandler->LogFile << "Test Failed.\n";
      }
    }
    *this->TestHandler->LogFile
      << "\"" << this->TestProperties->Name
      << "\" end time: " << this->CTest->CurrentTime() << std::endl
      << "\"" << this->TestProperties->Name << "\" time elapsed: " << buffer
      << std::endl
      << "----------------------------------------------------------"
      << std::endl
      << std::endl;
  }
  // if the test actually started and ran
  // record the results in TestResult
  if (started) {
    std::string compressedOutput;
    if (!this->TestHandler->MemCheck &&
        this->CTest->ShouldCompressTestOutput()) {
      std::string str = this->ProcessOutput;
      if (this->CTest->CompressString(str)) {
        compressedOutput = std::move(str);
      }
    }
    bool compress = !compressedOutput.empty() &&
      compressedOutput.length() < this->ProcessOutput.length();
    this->TestResult.Output =
      compress ? compressedOutput : this->ProcessOutput;
    this->TestResult.CompressOutput = compress;
    this->TestResult.ReturnValue = this->TestProcess->GetExitValue();
    if (!skipped) {
      this->TestResult.CompletionStatus = "Completed";
    }
    this->TestResult.ExecutionTime = this->TestProcess->GetTotalTime();
    this->MemCheckPostProcess();
    this->ComputeWeightedCost();
  }
  // If the test does not need to rerun push the current TestResult onto the
  // TestHandler vector
  if (!this->NeedsToRepeat()) {
    this->TestHandler->TestResults.push_back(this->TestResult);
  }
  this->TestProcess.reset();
  return passed || skipped;
}